

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

void P_MonsterFallingDamage(AActor *mo)

{
  DAngle in_XMM0_Qa;
  FName local_c;
  undefined8 local_8;
  
  if (((level.flags2._1_1_ & 1) != 0) && ((mo->floorsector->Flags & 2) == 0)) {
    local_c.Index = 0xc2;
    local_8 = 0;
    P_DamageMobj(mo,(AActor *)0x0,(AActor *)0x0,1000000,&local_c,0,in_XMM0_Qa);
  }
  return;
}

Assistant:

void P_MonsterFallingDamage (AActor *mo)
{
	int damage;
	double vel;

	if (!(level.flags2 & LEVEL2_MONSTERFALLINGDAMAGE))
		return;
	if (mo->floorsector->Flags & SECF_NOFALLINGDAMAGE)
		return;

	vel = fabs(mo->Vel.Z);
	if (vel > 35)
	{ // automatic death
		damage = TELEFRAG_DAMAGE;
	}
	else
	{
		damage = int((vel - 23)*6);
	}
	damage = TELEFRAG_DAMAGE;	// always kill 'em
	P_DamageMobj (mo, NULL, NULL, damage, NAME_Falling);
}